

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

Float pbrt::SpectrumToPhotometric(SpectrumHandle *s)

{
  undefined1 auVar1 [16];
  bool bVar2;
  RGBSpectrum *this;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  *in_RDI;
  Float FVar3;
  undefined1 auVar4 [64];
  Float lambda;
  Float y;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  float fVar5;
  float lambda_00;
  SpectrumHandle *in_stack_fffffffffffffff0;
  undefined1 extraout_var [60];
  
  bVar2 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          ::Is<pbrt::RGBSpectrum>(in_RDI);
  if (bVar2) {
    this = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           ::Cast<pbrt::RGBSpectrum>
                     ((TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                       *)0x8f6b13);
    RGBSpectrum::Illluminant(this);
    SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
              ((SpectrumHandle *)in_RDI,
               (DenselySampledSpectrum *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    SpectrumHandle::operator=
              ((SpectrumHandle *)in_RDI,
               (SpectrumHandle *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  lambda_00 = 0.0;
  for (fVar5 = 360.0; fVar5 <= 830.0; fVar5 = fVar5 + 1.0) {
    Spectra::Y();
    FVar3 = DenselySampledSpectrum::operator()
                      ((DenselySampledSpectrum *)CONCAT44(lambda_00,fVar5),
                       (Float)((ulong)in_RDI >> 0x20));
    auVar4._0_4_ = SpectrumHandle::operator()(in_stack_fffffffffffffff0,lambda_00);
    auVar4._4_60_ = extraout_var;
    auVar1 = vfmadd213ss_fma(auVar4._0_16_,ZEXT416((uint)FVar3),ZEXT416((uint)lambda_00));
    lambda_00 = auVar1._0_4_;
  }
  return lambda_00 * 683.0;
}

Assistant:

Float SpectrumToPhotometric(SpectrumHandle s) {
    // We have to handle RGBSpectrum separately here as it's composed of an
    // illuminant spectrum and an RGB multiplier. We only want to consider the
    // illuminant for the sake of this calculation, and we should consider the
    // RGB separately for the purposes of target power/illuminance computation
    // in the lights themselves (but we currently don't)
    if (s.Is<RGBSpectrum>())
        s = s.Cast<RGBSpectrum>()->Illluminant();

    Float y = 0;
    for (Float lambda = Lambda_min; lambda <= Lambda_max; ++lambda)
        y += Spectra::Y()(lambda) * s(lambda);

    return y * K_m;
}